

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O2

void * rec_del(pfx_table *pfxt)

{
  long lVar1;
  __pid_t _Var2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  pfx_record rec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = getpid();
  rec.min_len = ' ';
  rec.max_len = ' ';
  rec.prefix._0_8_ = 0;
  puts("removing records");
  for (uVar4 = max_i; min_i <= uVar4; uVar4 = uVar4 - 1) {
    rec.socket = (rtr_socket *)0x0;
    rec.min_len = ' ';
    rec.max_len = ' ';
    uVar5 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    rec.prefix._0_8_ = (ulong)uVar5 << 0x20;
    rec.asn = _Var2 % 2;
    pfx_table_remove(pfxt,&rec);
    rec.asn = _Var2 % 2 + 1;
    pfx_table_remove(pfxt,&rec);
    rec.min_len = 0x80;
    rec.max_len = 0x80;
    rec.prefix.u.addr6.addr[1] = min_i - 1;
    rec.prefix.u.addr6.addr[0] = uVar5 - 1;
    rec.prefix.ver = LRTR_IPV6;
    pfx_table_remove(pfxt,&rec);
    iVar3 = rand();
    usleep(iVar3 / 0x6666666);
  }
  puts("Done");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *rec_del(struct pfx_table *pfxt)
{
	const int tid = getpid();
	struct pfx_record rec;

	rec.min_len = 32;
	rec.max_len = 32;
	rec.prefix.ver = LRTR_IPV4;
	rec.prefix.u.addr4.addr = 0;
	printf("removing records\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		rec.socket = NULL;
		rec.min_len = 32;
		rec.max_len = 32;
		rec.asn = tid % 2;
		rec.prefix.ver = LRTR_IPV4;
		rec.prefix.u.addr4.addr = htonl(i);
		pfx_table_remove(pfxt, &rec);
		rec.asn = (tid % 2) + 1;
		pfx_table_remove(pfxt, &rec);

		rec.prefix.ver = LRTR_IPV6;
		rec.min_len = 128;
		rec.max_len = 128;
		rec.prefix.u.addr6.addr[1] = min_i + 0xFFFFFFFF;
		rec.prefix.u.addr6.addr[0] = htonl(i) + 0xFFFFFFFF;

		pfx_table_remove(pfxt, &rec);
		usleep(rand() / (RAND_MAX / 20));
	}
	printf("Done\n");

	return NULL;
}